

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutTruth.c
# Opt level: O1

void Cut_TruthComputeOld(Cut_Cut_t *pCut,Cut_Cut_t *pCut0,Cut_Cut_t *pCut1,int fCompl0,int fCompl1)

{
  uint uVar1;
  uint nWords;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint *puVar8;
  
  uVar1 = *(uint *)pCut;
  uVar5 = uVar1 >> 0x18 & 0xf;
  nWords = 1 << ((char)uVar5 - 5U & 0x1f);
  if (uVar5 < 6) {
    nWords = 1;
  }
  uVar2 = 0;
  if (0xfffffff < uVar1) {
    uVar7 = 0;
    uVar6 = 0;
    uVar2 = 0;
    do {
      if (uVar6 == *(uint *)pCut0 >> 0x1c) break;
      if (*(int *)(&pCut0[1].field_0x0 + (long)(int)uVar6 * 4) <=
          *(int *)(&pCut[1].field_0x0 + uVar7 * 4)) {
        if (*(int *)(&pCut[1].field_0x0 + uVar7 * 4) !=
            *(int *)(&pCut0[1].field_0x0 + (long)(int)uVar6 * 4)) goto LAB_00452310;
        uVar2 = uVar2 | 1 << ((uint)uVar7 & 0x1f);
        uVar6 = uVar6 + 1;
      }
      uVar7 = uVar7 + 1;
    } while (uVar1 >> 0x1c != uVar7);
  }
  puVar8 = Cut_TruthComputeOld::uTruth0;
  Extra_TruthExpand(uVar5,nWords,
                    (uint *)(&pCut0[1].field_0x0 + (ulong)((byte)pCut0->field_0x3 & 0xf) * 4),uVar2,
                    Cut_TruthComputeOld::uTruth0);
  uVar4 = (ulong)nWords;
  uVar7 = uVar4;
  if (fCompl0 != 0) {
    do {
      *puVar8 = ~*puVar8;
      puVar8 = puVar8 + 1;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  uVar1 = *(uint *)pCut;
  uVar5 = 0;
  if (0xfffffff < uVar1) {
    uVar7 = 0;
    uVar2 = 0;
    uVar5 = 0;
    do {
      if (uVar2 == *(uint *)pCut1 >> 0x1c) break;
      if (*(int *)(&pCut1[1].field_0x0 + (long)(int)uVar2 * 4) <=
          *(int *)(&pCut[1].field_0x0 + uVar7 * 4)) {
        if (*(int *)(&pCut[1].field_0x0 + uVar7 * 4) !=
            *(int *)(&pCut1[1].field_0x0 + (long)(int)uVar2 * 4)) {
LAB_00452310:
          __assert_fail("pCut->pLeaves[i] == pCut1->pLeaves[k]",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/cut/cutTruth.c"
                        ,0x42,"unsigned int Cut_TruthPhase(Cut_Cut_t *, Cut_Cut_t *)");
        }
        uVar5 = uVar5 | 1 << ((uint)uVar7 & 0x1f);
        uVar2 = uVar2 + 1;
      }
      uVar7 = uVar7 + 1;
    } while (uVar1 >> 0x1c != uVar7);
  }
  puVar8 = Cut_TruthComputeOld::uTruth1;
  Extra_TruthExpand(uVar1 >> 0x18 & 0xf,nWords,
                    (uint *)(&pCut1[1].field_0x0 + (ulong)((byte)pCut1->field_0x3 & 0xf) * 4),uVar5,
                    Cut_TruthComputeOld::uTruth1);
  uVar7 = uVar4;
  if (fCompl1 != 0) {
    do {
      *puVar8 = ~*puVar8;
      puVar8 = puVar8 + 1;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  uVar7 = (ulong)(*(uint *)pCut >> 0x16 & 0x3c);
  if ((*(uint *)pCut >> 0x17 & 1) == 0) {
    lVar3 = 0;
    do {
      *(uint *)(&pCut[1].field_0x0 + lVar3 + uVar7) =
           *(uint *)((long)Cut_TruthComputeOld::uTruth1 + lVar3) &
           *(uint *)((long)Cut_TruthComputeOld::uTruth0 + lVar3);
      lVar3 = lVar3 + 4;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  else {
    lVar3 = 0;
    do {
      *(uint *)(&pCut[1].field_0x0 + lVar3 + uVar7) =
           ~(*(uint *)((long)Cut_TruthComputeOld::uTruth1 + lVar3) &
            *(uint *)((long)Cut_TruthComputeOld::uTruth0 + lVar3));
      lVar3 = lVar3 + 4;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  return;
}

Assistant:

void Cut_TruthComputeOld( Cut_Cut_t * pCut, Cut_Cut_t * pCut0, Cut_Cut_t * pCut1, int fCompl0, int fCompl1 )
{
    static unsigned uTruth0[8], uTruth1[8];
    int nTruthWords = Cut_TruthWords( pCut->nVarsMax );
    unsigned * pTruthRes;
    int i, uPhase;

    // permute the first table
    uPhase = Cut_TruthPhase( pCut, pCut0 );
    Extra_TruthExpand( pCut->nVarsMax, nTruthWords, Cut_CutReadTruth(pCut0), uPhase, uTruth0 );
    if ( fCompl0 ) 
    {
        for ( i = 0; i < nTruthWords; i++ )
            uTruth0[i] = ~uTruth0[i];
    }

    // permute the second table
    uPhase = Cut_TruthPhase( pCut, pCut1 );
    Extra_TruthExpand( pCut->nVarsMax, nTruthWords, Cut_CutReadTruth(pCut1), uPhase, uTruth1 );
    if ( fCompl1 ) 
    {
        for ( i = 0; i < nTruthWords; i++ )
            uTruth1[i] = ~uTruth1[i];
    }

    // write the resulting table
    pTruthRes = Cut_CutReadTruth(pCut);

    if ( pCut->fCompl )
    {
        for ( i = 0; i < nTruthWords; i++ )
            pTruthRes[i] = ~(uTruth0[i] & uTruth1[i]);
    }
    else
    {
        for ( i = 0; i < nTruthWords; i++ )
            pTruthRes[i] = uTruth0[i] & uTruth1[i];
    }
}